

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O3

void __thiscall libtorrent::aux::utp_socket_impl::issue_read(utp_socket_impl *this)

{
  bool bVar1;
  size_t sVar2;
  error_code read_error;
  error_code local_20;
  
  *(ushort *)&this->field_0x21c =
       (ushort)*(undefined4 *)&this->field_0x21c & 0xf7ff |
       (ushort)(this->m_read_buffer_size == 0) << 0xb;
  this->m_read_handler = true;
  bVar1 = test_socket_state(this);
  if (!bVar1) {
    local_20.val_ = 0;
    local_20.failed_ = false;
    local_20.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    sVar2 = read_some(this,false,&local_20);
    this->m_read = this->m_read + (int)sVar2;
    maybe_trigger_receive_callback(this,&local_20);
  }
  return;
}

Assistant:

void utp_socket_impl::issue_read()
{
	TORRENT_ASSERT(m_userdata);
	TORRENT_ASSERT(!m_read_handler);

	m_null_buffers = m_read_buffer_size == 0;

	m_read_handler = true;
	if (test_socket_state()) return;

	UTP_LOGV("%8p: new read handler. %d bytes in buffer\n"
		, static_cast<void*>(this), m_receive_buffer_size);

	// so, the client wants to read. If we already
	// have some data in the read buffer, move it into the
	// client's buffer right away

	error_code read_error;
	m_read += int(read_some(false, read_error));
	maybe_trigger_receive_callback(read_error);
}